

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemTools::GetCurrentDateTime_abi_cxx11_
          (string *__return_storage_ptr__,SystemTools *this,char *format)

{
  tm *__tp;
  time_t t;
  char buf [1024];
  allocator<char> local_421;
  time_t local_420;
  char local_418 [1024];
  
  time(&local_420);
  __tp = localtime(&local_420);
  strftime(local_418,0x400,(char *)this,__tp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_418,&local_421);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetCurrentDateTime(const char* format)
{
  char buf[1024];
  time_t t;
  time(&t);
  strftime(buf, sizeof(buf), format, localtime(&t));
  return std::string(buf);
}